

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,double t,vector<bool,_std::allocator<bool>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__x;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_98;
  undefined1 local_68 [8];
  optional<std::vector<bool,_std::allocator<bool>_>_> v;
  TimeSampleInterpolationType tinterp_local;
  vector<bool,_std::allocator<bool>_> *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (vector<bool,_std::allocator<bool>_> *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x20),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x20));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_98,&this->_var);
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::
      optional<std::vector<bool,_std::allocator<bool>_>,_0>
                ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_68,&local_98);
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                (&local_98);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_68);
      if (bVar1) {
        __x = nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::value
                        ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_68);
        std::vector<bool,_std::allocator<bool>_>::operator=(dst,__x);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_68);
      if (bVar1) goto LAB_00289081;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<std::vector<bool,std::allocator<bool>>>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<std::vector<bool,std::allocator<bool>>>(this,dst);
    }
  }
LAB_00289081:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }